

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

void __thiscall CLI::RequiresError::~RequiresError(RequiresError *this)

{
  RequiresError *this_local;
  
  ParseError::~ParseError(&this->super_ParseError);
  return;
}

Assistant:

RequiresError(std::string curname, std::string subname)
        : RequiresError(curname + " requires " + subname, ExitCodes::RequiresError) {}